

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aalcalcmeanonly.cpp
# Opt level: O0

void aalcalcmeanonly::OutputRows(bool skipHeader,bool ordOutput,string *parquetOutFile)

{
  byte bVar1;
  string *parquetOutFile_local;
  bool ordOutput_local;
  bool skipHeader_local;
  
  bVar1 = std::__cxx11::string::empty();
  if (((bVar1 & 1) != 0) || (ordOutput)) {
    WriteCsvOutputFile(skipHeader,ordOutput);
  }
  return;
}

Assistant:

void OutputRows(const bool skipHeader, const bool ordOutput,
		  const std::string& parquetOutFile) {
  /* !parquetOutfile.empty() | ordOutput | output files
  * ---------------------------------------------------
  *            1             |     1     | ORD parquet and csv
  *            1             |     0     | ORD parquet
  *            0             |     1     | ORD csv
  *            0             |     0     | legacy csv
  */

    if (!(!parquetOutFile.empty() && !ordOutput)) {
      WriteCsvOutputFile(skipHeader, ordOutput);
    }

#ifdef HAVE_PARQUET
    if (!parquetOutFile.empty()) WriteParquetOutputFile(parquetOutFile);
#endif

  }